

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::Approx::setMargin(Approx *this,double newMargin)

{
  string local_38;
  ReusableStringStream local_18;
  
  if (0.0 <= newMargin) {
    this->m_margin = newMargin;
    return;
  }
  ReusableStringStream::ReusableStringStream(&local_18);
  std::__ostream_insert<char,std::char_traits<char>>(local_18.m_oss,"Invalid Approx::margin: ",0x18)
  ;
  std::ostream::_M_insert<double>(newMargin);
  local_38._M_dataplus._M_p._0_1_ = 0x2e;
  std::__ostream_insert<char,std::char_traits<char>>(local_18.m_oss,(char *)&local_38,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_18.m_oss," Approx::Margin has to be non-negative.",0x27);
  std::__cxx11::stringbuf::str();
  throw_domain_error(&local_38);
}

Assistant:

void Approx::setMargin(double newMargin) {
        CATCH_ENFORCE(newMargin >= 0,
            "Invalid Approx::margin: " << newMargin << '.'
            << " Approx::Margin has to be non-negative.");
        m_margin = newMargin;
    }